

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

void noisy_hit(monst *mtmp,obj *otmp,obj *ostack,int thrown)

{
  boolean bVar1;
  int iVar2;
  bool bVar3;
  char local_35;
  int local_34;
  schar skilltype;
  monst *pmStack_30;
  int noiserange;
  monst *mtmp2;
  int thrown_local;
  obj *ostack_local;
  obj *otmp_local;
  monst *mtmp_local;
  
  local_35 = '\0';
  if ((otmp != (obj *)0x0) && (otmp->oclass == '\x02')) {
    local_35 = objects[otmp->otyp].oc_subtyp;
  }
  if ((otmp == (obj *)0x0) ||
     (bVar1 = oprop_stealth_attack(otmp,ostack,uwep,(boolean)thrown), bVar1 == '\0')) {
    if ((((otmp == (obj *)0x0) || (thrown == 0)) ||
        ((((otmp->oclass != '\x02' && (otmp->oclass != '\r')) ||
          ((((objects[otmp->otyp].oc_subtyp < -0x18 || (-0x16 < objects[otmp->otyp].oc_subtyp)) ||
            (uwep == (obj *)0x0)) ||
           (((int)objects[otmp->otyp].oc_subtyp != -(int)objects[uwep->otyp].oc_subtyp ||
            (iVar2 = rn2(3), iVar2 == 0)))))) &&
         ((otmp->otyp != 7 && ((otmp->otyp != 8 && (local_35 != '\x02')))))))) &&
       (((otmp == (obj *)0x0 ||
         (((u.uprops[0x13].intrinsic == 0 && (u.uprops[0x13].extrinsic == 0)) ||
          (u.uprops[0x13].blocked != 0)))) || (local_35 != '\x02')))) {
      if ((u.uprops[0x13].intrinsic != 0) || (bVar3 = false, u.uprops[0x13].extrinsic != 0)) {
        bVar3 = u.uprops[0x13].blocked == 0;
      }
      local_34 = 0x40;
      if (bVar3) {
        local_34 = 9;
      }
      if ((otmp != (obj *)0x0) &&
         (((otmp->oclass != '\x02' || (otmp->oartifact == '\x05')) || (otmp->otyp == 0x41)))) {
        local_34 = 0x40;
      }
      for (pmStack_30 = level->monlist; pmStack_30 != (monst *)0x0; pmStack_30 = pmStack_30->nmon) {
        iVar2 = dist2((int)mtmp->mx,(int)mtmp->my,(int)pmStack_30->mx,(int)pmStack_30->my);
        if (iVar2 < local_34) {
          iVar2 = 5;
          if (urole.malenum == 0x164) {
            iVar2 = 3;
          }
          iVar2 = rn2(iVar2);
          if (iVar2 != 0) {
            *(uint *)&pmStack_30->field_0x60 = *(uint *)&pmStack_30->field_0x60 & 0xfff7ffff;
          }
        }
      }
    }
  }
  else {
    oprop_id(0x4000,otmp,ostack,uwep);
  }
  return;
}

Assistant:

static void noisy_hit(struct monst *mtmp, struct obj *otmp,
		      struct obj *ostack, int thrown)
{
	struct monst *mtmp2;
	int noiserange;
	schar skilltype = P_NONE;

	if (otmp && otmp->oclass == WEAPON_CLASS)
	    skilltype = objects[otmp->otyp].oc_skill;

	/* Weapons and launchers of stealth don't make noise. */
	if (otmp && oprop_stealth_attack(otmp, ostack, uwep, thrown)) {
	    oprop_id(ITEM_STEALTH, otmp, ostack, uwep);
	    return;
	}

	/* properly fired missiles shouldn't make much noise on impact,
	 * and thrown darts, shuriken, and knives are by definition sneaky */
	if (otmp && thrown) {
	    if ((ammo_and_launcher(otmp, uwep) && rn2(3)) ||
		otmp->otyp == DART ||
		otmp->otyp == SHURIKEN ||
		skilltype == P_KNIFE) {
		return;
	    }
	}

	/* If you're stealthy, you can slit throats with knives */
	if (otmp && Stealth && skilltype == P_KNIFE)
	    return;

	/* Stealth will reduce the amount of noise made while fighting,
	 * but won't reduce it entirely to zero */
	noiserange = Stealth ? 9 : 64;

	/* Some things are just never sneaky.
	 * For example, smacking things with lightning is loud.
	 * (TODO: add wand sounds for loud wands) */
	if (otmp &&
	    (otmp->oclass != WEAPON_CLASS ||
	     otmp->oartifact == ART_MJOLLNIR ||
	     otmp->otyp == BULLWHIP)) {
	    noiserange = 64;
	}

	/* Check and see who was close enough to hear it */
	for (mtmp2 = level->monlist; mtmp2; mtmp2 = mtmp2->nmon) {
	    if (dist2(mtmp->mx, mtmp->my, mtmp2->mx, mtmp2->my) < noiserange) {
		/* Rogues get a bit of a bonus for knowing how to kill
		 * in nice, quiet ways */
		if (rn2(Role_if(PM_ROGUE) ? 3 : 5))
		    mtmp2->msleeping = 0;
	    }
	}
}